

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O3

void poly_genresult(ssh2_mac *mac,uchar *blk)

{
  ulong *puVar1;
  BinarySink *pBVar2;
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  BinarySink *pBVar7;
  BignumInt v5;
  long lVar8;
  ssh2_macalg *psVar9;
  uchar *data_1;
  ssh2_macalg *psVar10;
  uchar *data;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ulong local_38 [4];
  
  if (*(int *)&mac[-3].binarysink_ != 0) {
    poly1305_feed_chunk((poly1305 *)&mac[-8].binarysink_,(uchar *)&mac[-4].binarysink_,
                        *(int *)&mac[-3].binarysink_);
  }
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  bVar4 = 0;
  lVar8 = 0;
  do {
    puVar1 = (ulong *)((long)local_38 + (ulong)((uint)lVar8 & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)*(byte *)((long)&mac[-8].binarysink_ + lVar8) << (bVar4 & 0x38);
    lVar8 = lVar8 + 1;
    bVar4 = bVar4 + 8;
  } while (lVar8 != 0x10);
  uVar5 = (uint)mac[-4].vt & 3;
  uVar13 = ((ulong)mac[-4].vt >> 2) * 5;
  uVar15 = (long)&(mac[-5].vt)->new + uVar13;
  pBVar2 = mac[-5].binarysink_;
  uVar13 = (ulong)CARRY8(uVar13,(ulong)mac[-5].vt);
  uVar6 = (long)&pBVar2->write + uVar13;
  uVar14 = (ulong)(uVar5 + CARRY8((ulong)pBVar2,uVar13) +
                   (uint)CARRY8(uVar6,(ulong)(0xfffffffffffffffa < uVar15)) >> 2) * 5;
  psVar10 = (ssh2_macalg *)(uVar14 + uVar15);
  uVar14 = (ulong)CARRY8(uVar14,uVar15);
  pBVar7 = (BinarySink *)(uVar6 + uVar14);
  psVar9 = (ssh2_macalg *)
           (ulong)(CARRY8(uVar6,uVar14) + uVar5 + (uint)CARRY8((ulong)pBVar2,uVar13) & 3);
  mac[-5].vt = psVar10;
  mac[-5].binarysink_ = pBVar7;
  mac[-4].vt = psVar9;
  bVar11 = CARRY8(local_38[0],(ulong)psVar10);
  local_38[0] = (long)&psVar10->new + local_38[0];
  bVar12 = CARRY8(local_38[1],(ulong)pBVar7);
  uVar13 = (long)&pBVar7->write + local_38[1];
  local_38[1] = uVar13 + bVar11;
  local_38[2] = (long)&psVar9->new + (bVar12 || CARRY8(uVar13,(ulong)bVar11)) + local_38[2];
  uVar13 = 0;
  uVar14 = 1;
  lVar8 = 0;
  do {
    uVar6 = *(ulong *)((long)local_38 + (ulong)((uint)lVar8 & 0xfffffff8));
    uVar15 = uVar6 >> ((uVar13 & 7) << 3);
    uVar3 = (ushort)uVar15 & 0xff;
    bVar16 = (byte)(uVar6 >> ((uVar14 & 7) << 3));
    bVar4 = ((uVar15 & 0xff) != 0) * (uVar3 < 0x100) * (char)uVar15 - (0xff < uVar3);
    bVar16 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    bVar16 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    *(ushort *)(blk + lVar8) =
         CONCAT11((bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16),
                  (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4));
    lVar8 = lVar8 + 2;
    uVar13 = uVar13 + 2;
    uVar14 = uVar14 + 2;
  } while (lVar8 != 0x10);
  return;
}

Assistant:

static void poly_genresult(ssh2_mac *mac, unsigned char *blk)
{
    struct ccp_context *ctx = container_of(mac, struct ccp_context, mac_if);
    poly1305_finalise(&ctx->mac, blk);
}